

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles31::Functional::UsubBorrowCase::compare(UsubBorrowCase *this,void **inputs,void **outputs)

{
  Precision PVar1;
  pointer pSVar2;
  uint *puVar3;
  long lVar4;
  uint uVar5;
  ostream *poVar6;
  uint uVar7;
  ostringstream *this_00;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  Hex<8UL> local_38;
  
  pSVar2 = (this->super_IntegerFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar1 = (pSVar2->varType).m_data.basic.precision;
  uVar5 = glu::getDataTypeScalarSize((pSVar2->varType).m_data.basic.type);
  bVar12 = true;
  if (0 < (int)uVar5) {
    uVar7 = (2 << ((&DAT_01c53720)[(ulong)PVar1 * 4] - 1 & 0x1f)) - 1;
    puVar3 = (uint *)inputs[1];
    uVar9 = **inputs;
    bVar11 = uVar9 < *puVar3;
    uVar9 = uVar9 - *puVar3;
    if (((**outputs ^ uVar9) & uVar7) == 0) {
      bVar12 = false;
      uVar8 = 0;
      do {
        uVar10 = uVar8;
        if (*(uint *)((long)outputs[1] + uVar8 * 4) != (uint)bVar11) break;
        if ((ulong)uVar5 - 1 == uVar8) {
          return true;
        }
        uVar10 = uVar8 + 1;
        bVar12 = uVar5 <= uVar10;
        uVar9 = *(uint *)((long)*inputs + (uVar8 + 1) * 4);
        bVar11 = uVar9 < puVar3[uVar8 + 1];
        uVar9 = uVar9 - puVar3[uVar8 + 1];
        lVar4 = uVar8 + 1;
        uVar8 = uVar10;
      } while (((*(uint *)((long)*outputs + lVar4 * 4) ^ uVar9) & uVar7) == 0);
    }
    else {
      bVar12 = false;
      uVar10 = 0;
    }
    this_00 = &(this->super_IntegerFunctionCase).m_failMsg;
    std::__ostream_insert<char,std::char_traits<char>>
              (&this_00->super_basic_ostream<char,_std::char_traits<char>_>,"Expected [",10);
    poVar6 = (ostream *)std::ostream::operator<<(this_00,(int)uVar10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] = ",4);
    local_38.value = (deUint64)uVar9;
    poVar6 = tcu::Format::Hex<8UL>::toStream(&local_38,poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    local_38.value = (deUint64)bVar11;
    tcu::Format::Hex<8UL>::toStream(&local_38,poVar6);
  }
  return bVar12;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const int				integerLength	= getShaderUintBitCount(m_shaderType, precision);
		const deUint32			mask0			= getLowBitMask(integerLength);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const deUint32	in0		= ((const deUint32*)inputs[0])[compNdx];
			const deUint32	in1		= ((const deUint32*)inputs[1])[compNdx];
			const deUint32	out0	= ((const deUint32*)outputs[0])[compNdx];
			const deUint32	out1	= ((const deUint32*)outputs[1])[compNdx];
			const deUint32	ref0	= in0-in1;
			const deUint32	ref1	= in0 >= in1 ? 0u : 1u;

			if (((out0&mask0) != (ref0&mask0)) || out1 != ref1)
			{
				m_failMsg << "Expected [" << compNdx << "] = " << tcu::toHex(ref0) << ", " << tcu::toHex(ref1);
				return false;
			}
		}

		return true;
	}